

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

HighsInt __thiscall HighsSymmetries::getOrbit(HighsSymmetries *this,HighsInt col)

{
  int iVar1;
  bool bVar2;
  reference pvVar3;
  int in_ESI;
  value_type_conflict2 *in_RDI;
  HighsInt orbit;
  HighsInt i;
  int iVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar6;
  int local_4;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x18),(long)in_ESI);
  if (*pvVar3 == -1) {
    local_4 = -1;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)*pvVar3);
    iVar5 = *pvVar3;
    iVar6 = iVar5;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)iVar5);
    local_4 = iVar6;
    if (iVar5 != *pvVar3) {
      do {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_ffffffffffffffe0),
                   in_RDI);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)iVar6);
        iVar4 = *pvVar3;
        iVar6 = iVar4;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)iVar4);
      } while (iVar4 != *pvVar3);
      do {
        pvVar3 = std::vector<int,_std::allocator<int>_>::back
                           ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,iVar4));
        iVar1 = *pvVar3;
        std::vector<int,_std::allocator<int>_>::pop_back
                  ((vector<int,_std::allocator<int>_> *)0x6c34b2);
        local_4 = iVar6;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc),(long)iVar1);
        *pvVar3 = iVar6;
        bVar2 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(local_4,in_stack_ffffffffffffffe0));
        iVar6 = local_4;
      } while (((bVar2 ^ 0xffU) & 1) != 0);
    }
  }
  return local_4;
}

Assistant:

HighsInt HighsSymmetries::getOrbit(HighsInt col) {
  HighsInt i = columnPosition[col];
  if (i == -1) return -1;
  HighsInt orbit = orbitPartition[i];
  if (orbit != orbitPartition[orbit]) {
    do {
      linkCompressionStack.push_back(i);
      i = orbit;
      orbit = orbitPartition[orbit];
    } while (orbit != orbitPartition[orbit]);

    do {
      i = linkCompressionStack.back();
      linkCompressionStack.pop_back();
      orbitPartition[i] = orbit;
    } while (!linkCompressionStack.empty());
  }

  return orbit;
}